

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O2

void __thiscall dg::llvmdg::legacy::Block::Block(Block *this,BasicBlock *b,bool callReturn)

{
  _Rb_tree_header *p_Var1;
  
  this->_llvm_blk = b;
  (this->llvmInstructions_).
  super__Vector_base<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->llvmInstructions_).
  super__Vector_base<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->llvmInstructions_).
  super__Vector_base<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->predecessors_)._M_t._M_impl.super__Rb_tree_header;
  (this->predecessors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->predecessors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->predecessors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->predecessors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->predecessors_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->successors_)._M_t._M_impl.super__Rb_tree_header;
  (this->successors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->successors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->successors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->successors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->successors_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->callReturn = callReturn;
  this->traversalId_ = 0;
  p_Var1 = &(this->callees_)._M_t._M_impl.super__Rb_tree_header;
  (this->callees_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->callees_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->callees_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->callees_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->callees_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->forks_)._M_t._M_impl.super__Rb_tree_header;
  (this->forks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->forks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->forks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->forks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->forks_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->joins_)._M_t._M_impl.super__Rb_tree_header;
  (this->joins_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->joins_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->joins_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->joins_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->joins_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

Block(const llvm::BasicBlock *b, bool callReturn = false)
            : _llvm_blk(b), callReturn(callReturn) {}